

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SrcListIndexedBy(Parse *pParse,SrcList *p,Token *pIndexedBy)

{
  undefined1 *puVar1;
  int iVar2;
  byte bVar3;
  char *pcVar4;
  
  if ((p != (SrcList *)0x0) && (pIndexedBy->n != 0)) {
    iVar2 = p->nSrc;
    if ((pIndexedBy->n == 1) && (pIndexedBy->z == (char *)0x0)) {
      bVar3 = 1;
    }
    else {
      pcVar4 = sqlite3NameFromToken(pParse->db,pIndexedBy);
      p->a[(long)iVar2 + -1].u1.zIndexedBy = pcVar4;
      bVar3 = 2;
    }
    puVar1 = &p->a[(long)iVar2 + -1].fg.field_0x1;
    *puVar1 = *puVar1 | bVar3;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListIndexedBy(Parse *pParse, SrcList *p, Token *pIndexedBy){
  assert( pIndexedBy!=0 );
  if( p && pIndexedBy->n>0 ){
    struct SrcList_item *pItem;
    assert( p->nSrc>0 );
    pItem = &p->a[p->nSrc-1];
    assert( pItem->fg.notIndexed==0 );
    assert( pItem->fg.isIndexedBy==0 );
    assert( pItem->fg.isTabFunc==0 );
    if( pIndexedBy->n==1 && !pIndexedBy->z ){
      /* A "NOT INDEXED" clause was supplied. See parse.y 
      ** construct "indexed_opt" for details. */
      pItem->fg.notIndexed = 1;
    }else{
      pItem->u1.zIndexedBy = sqlite3NameFromToken(pParse->db, pIndexedBy);
      pItem->fg.isIndexedBy = 1;
    }
  }
}